

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
               (QWindow *args,unsigned_long args_1,Type args_2,int args_3,
               QFlags<Qt::KeyboardModifier> args_4,uint args_5,uint args_6,uint args_7,
               QString *args_8,bool args_9,unsigned_short args_10)

{
  uint uVar1;
  ulong uVar2;
  QInputDevice *pQVar3;
  QFlagsStorage<Qt::KeyboardModifier> in_EDX;
  ushort in_SI;
  long in_FS_OFFSET;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  ulong in_stack_00000018;
  undefined1 in_stack_00000020;
  ushort in_stack_00000028;
  KeyEvent event;
  undefined4 in_stack_fffffffffffffe58;
  ProcessEventsFlag in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  Type t;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe84;
  QString *in_stack_fffffffffffffea0;
  quint32 in_stack_fffffffffffffea8;
  quint32 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  QFlagsStorage<QEventLoop::ProcessEventsFlag> in_stack_fffffffffffffebc;
  uint uVar4;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined2 in_stack_fffffffffffffede;
  bool local_ed;
  uint in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  QString *in_stack_ffffffffffffff40;
  unsigned_short in_stack_ffffffffffffff50;
  undefined1 local_a8 [16];
  byte local_98;
  long local_28;
  
  t = (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QThread::isMainThread();
  if ((uVar2 & 1) == 0) {
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (QString *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,unsigned_int,unsigned_int,unsigned_int,QString,bool,unsigned_short>
              ((QWindow *)
               CONCAT26(in_stack_fffffffffffffede,
                        CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)),
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8,
               (QFlags<Qt::KeyboardModifier>)in_EDX.i,
               (uint)((ulong)in_stack_fffffffffffffec0 >> 0x20),in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
               SUB81((ulong)in_stack_fffffffffffffec0 >> 0x18,0),in_stack_ffffffffffffff50);
    QString::~QString((QString *)0x44b7a4);
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_00000010),in_stack_fffffffffffffe5c);
    local_ed = QWindowSystemInterface::flushWindowSystemEvents
                         ((ProcessEventsFlags)in_stack_fffffffffffffebc.i);
    goto LAB_0044b7c8;
  }
  memset(local_a8,0xaa,0x80);
  uVar4 = CONCAT13(in_stack_00000020,(int3)in_stack_fffffffffffffebc.i) & 0x1ffffff;
  QString::QString((QString *)0x44b5d5);
  pQVar3 = QInputDevice::primaryKeyboard(in_stack_fffffffffffffea0);
  uVar1 = (uint)((byte)(uVar4 >> 0x18) & 1);
  QWindowSystemInterfacePrivate::KeyEvent::KeyEvent
            ((KeyEvent *)CONCAT44(in_stack_fffffffffffffe84,(uint)in_stack_00000028),
             (QWindow *)CONCAT44(in_stack_fffffffffffffe7c,uVar1),in_stack_00000018,t,
             in_stack_00000010,
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84((ulong)pQVar3 >> 0x20,0),
             (quint32)in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
             (QString *)CONCAT44(uVar4,in_stack_fffffffffffffeb8),
             SUB41((uint)in_stack_fffffffffffffe64 >> 0x18,0),in_SI,
             (QInputDevice *)CONCAT44(in_EDX.i,in_stack_fffffffffffffed0));
  QString::~QString((QString *)0x44b655);
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent
              ((WindowSystemEvent *)CONCAT44(in_stack_fffffffffffffe7c,uVar1));
LAB_0044b6a2:
    local_ed = (bool)(local_98 & 1);
  }
  else {
    uVar1 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,local_a8);
    if ((uVar1 & 1) != 0) goto LAB_0044b6a2;
    local_ed = false;
  }
  QWindowSystemInterfacePrivate::KeyEvent::~KeyEvent
            ((KeyEvent *)CONCAT44(in_stack_fffffffffffffe64,in_stack_00000008));
LAB_0044b7c8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return local_ed;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}